

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

int __thiscall CVmTimeZoneCache::load_db_index(CVmTimeZoneCache *this)

{
  uint *puVar1;
  byte bVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  FILE *__stream;
  size_t sVar8;
  char *pcVar9;
  undefined8 *puVar10;
  CVmHashEntry *this_00;
  ZoneHashEntryLink *this_01;
  CVmHashTable *pCVar11;
  undefined8 *puVar12;
  AbbrHashEntry *this_02;
  long lVar13;
  undefined8 uVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  uint uVar18;
  ZoneHashEntry *link_to;
  uint *puVar19;
  bool bVar20;
  char buf [24];
  ulong local_88;
  ulong local_70;
  int local_58 [4];
  int local_48;
  uint local_44;
  ulong local_38;
  
  if (this->index_loaded_ != 0) {
    return this->index_loaded_ok_;
  }
  this->index_loaded_ = 1;
  iVar7 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
  __stream = (FILE *)CResLoader::open_res_file
                               ((CResLoader *)CONCAT44(extraout_var,iVar7),"timezones.t3tz",
                                (char *)0x0,"TMZN");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  sVar8 = fread(local_58,0x18,1,__stream);
  bVar20 = local_58[0] == 0x5a543354 && sVar8 == 1;
  if (local_58[0] == 0x5a543354 && sVar8 == 1) {
    local_70 = (ulong)(local_48 - 4);
    pcVar9 = (char *)operator_new__(local_70);
    this->zone_bytes_ = pcVar9;
    sVar8 = fread(pcVar9,local_70,1,__stream);
    bVar20 = sVar8 == 1;
    uVar5 = local_44;
  }
  else {
    uVar5 = 0;
    local_70 = 0;
  }
  uVar18 = 0;
  if (bVar20) {
    sVar8 = fread(local_58,8,1,__stream);
    if (sVar8 == 1) {
      uVar17 = (ulong)(local_58[0] - 4);
      pcVar9 = (char *)operator_new__(uVar17);
      this->link_bytes_ = pcVar9;
      sVar8 = fread(pcVar9,uVar17,1,__stream);
      bVar20 = sVar8 != 1;
    }
    else {
      uVar17 = 0;
      bVar20 = false;
    }
  }
  else {
    bVar20 = true;
    uVar17 = 0;
  }
  local_38 = uVar17;
  if (!bVar20) {
    sVar8 = fread(local_58,8,1,__stream);
    if (sVar8 == 1) {
      local_88 = (ulong)(local_58[0] - 4);
      pcVar9 = (char *)operator_new__(local_88);
      this->abbr_bytes_ = pcVar9;
      sVar8 = fread(pcVar9,local_88,1,__stream);
      uVar18 = (uint)(sVar8 == 1);
      goto LAB_002939e7;
    }
    uVar18 = 1;
  }
  local_88 = 0;
LAB_002939e7:
  fclose(__stream);
  if (uVar18 == 0) {
    puVar10 = (undefined8 *)0x0;
  }
  else {
    puVar10 = (undefined8 *)operator_new__((ulong)uVar5 << 3);
    if (local_70 != 0) {
      pbVar15 = (byte *)this->zone_bytes_;
      pbVar16 = pbVar15 + local_70;
      puVar12 = puVar10;
      do {
        uVar17 = (ulong)*pbVar15;
        this_00 = (CVmHashEntry *)operator_new(0x48);
        uVar3 = *(undefined4 *)(pbVar15 + uVar17 + 2);
        CVmHashEntry::CVmHashEntry(this_00,(char *)(pbVar15 + 1),uVar17,0);
        this_00[1]._vptr_CVmHashEntry = (_func_int **)0x0;
        *(undefined4 *)&this_00->field_0x24 = 1;
        this_00[1].nxt_ = (CVmHashEntry *)0x0;
        this_00[1].str_ = (char *)0x0;
        this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__ZoneHashEntry_0036cc50;
        *(undefined4 *)&this_00[1].len_ = uVar3;
        *(undefined2 *)((long)&this_00[1].len_ + 4) = *(undefined2 *)(pbVar15 + uVar17 + 6);
        CVmHashTable::add(this->db_tab_,this_00);
        *puVar12 = this_00;
        pbVar15 = pbVar15 + uVar17 + 8;
        puVar12 = puVar12 + 1;
      } while (pbVar15 < pbVar16);
    }
    if (local_38 != 0) {
      pbVar16 = (byte *)this->link_bytes_;
      pbVar15 = pbVar16 + local_38;
      do {
        uVar17 = (ulong)*pbVar16;
        if (*(uint *)(pbVar16 + uVar17 + 2) < uVar5) {
          link_to = (ZoneHashEntry *)puVar10[*(uint *)(pbVar16 + uVar17 + 2)];
        }
        else {
          link_to = (ZoneHashEntry *)0x0;
        }
        if (link_to != (ZoneHashEntry *)0x0) {
          pCVar11 = this->db_tab_;
          this_01 = (ZoneHashEntryLink *)operator_new(0x50);
          ZoneHashEntryLink::ZoneHashEntryLink(this_01,(char *)(pbVar16 + 1),uVar17,0,link_to);
          CVmHashTable::add(pCVar11,(CVmHashEntry *)this_01);
        }
        pbVar16 = pbVar16 + uVar17 + 6;
      } while (pbVar16 < pbVar15);
    }
  }
  if (uVar18 != 0) {
    pCVar11 = (CVmHashTable *)operator_new(0x20);
    puVar12 = (undefined8 *)operator_new(8);
    *puVar12 = &PTR__CVmHashFunc_0036d878;
    CVmHashTable::init(pCVar11,(EVP_PKEY_CTX *)0x40);
    this->abbr_tab_ = pCVar11;
    if (local_88 != 0) {
      puVar19 = (uint *)this->abbr_bytes_;
      puVar1 = (uint *)(local_88 + (long)puVar19);
      do {
        uVar17 = (ulong)(byte)*puVar19;
        bVar2 = *(byte *)((long)puVar19 + uVar17 + 2);
        this_02 = (AbbrHashEntry *)operator_new(0x30);
        AbbrHashEntry::AbbrHashEntry(this_02,(char *)((long)puVar19 + 1),uVar17,0,(uint)bVar2);
        CVmHashTable::add(this->abbr_tab_,(CVmHashEntry *)this_02);
        puVar19 = (uint *)((long)puVar19 + uVar17 + 3);
        if (bVar2 != 0) {
          lVar13 = 0;
          do {
            if (*puVar19 < uVar5) {
              uVar14 = puVar10[*puVar19];
            }
            else {
              uVar14 = 0;
            }
            uVar4 = puVar19[1];
            uVar6 = puVar19[2];
            *(undefined8 *)((long)&this_02->entries->zone + lVar13) = uVar14;
            *(uint *)((long)&this_02->entries->gmtofs + lVar13) = uVar4;
            (&this_02->entries->dst)[lVar13] = (byte)uVar6;
            puVar19 = (uint *)((long)puVar19 + 9);
            lVar13 = lVar13 + 0x10;
          } while ((ulong)bVar2 * 0x10 != lVar13);
        }
      } while (puVar19 < puVar1);
    }
  }
  if (puVar10 != (undefined8 *)0x0) {
    operator_delete__(puVar10);
  }
  this->index_loaded_ok_ = uVar18;
  return uVar18;
}

Assistant:

int CVmTimeZoneCache::load_db_index(VMG0_)
{
    /* if we've already loaded the index (or tried to), we're done */
    if (index_loaded_)
        return index_loaded_ok_;

    /* we've now tried loading the index */
    index_loaded_ = TRUE;

    /* open the zone file */
    osfildef *fp = open_zoneinfo_file(vmg0_);
    if (fp == 0)
        return FALSE;

    /* read the signature */
    char buf[24];
    int ok = !osfrb(fp, buf, 24) && memcmp(buf, "T3TZ", 4) == 0;

    /* if the signature checked out, read the zone table */
    uint32_t zone_table_len = 0, zone_cnt = 0;
    if (ok)
    {
        /* decode the zone name table length */
        zone_table_len = osrp4(buf + 16) - 4;
        zone_cnt = osrp4(buf + 20);
        
        /* allocate space to load the table */
        zone_bytes_ = new char[zone_table_len];

        /* read the table */
        ok = zone_bytes_ != 0 && !osfrb(fp, zone_bytes_, zone_table_len);
    }

    /* if everything is working so far, read the link table */
    uint32_t link_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the link table */
        link_table_len = osrp4(buf) - 4;
        /* uint32_t link_cnt = osrp4(buf+4) - not currently needed */
        link_bytes_ = new char[link_table_len];
        ok = link_bytes_ != 0 && !osfrb(fp, link_bytes_, link_table_len);
    }

    /* if we're still good, read the abbreviation mappings */
    uint32_t abbr_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the abbreviation table */
        abbr_table_len = osrp4(buf) - 4;
        /* uint32_t abbr_cnt = osrp4(buf + 4) - not currently needed */
        abbr_bytes_ = new char[abbr_table_len];
        ok = abbr_bytes_ != 0 && !osfrb(fp, abbr_bytes_, abbr_table_len);
    }

    /* we're done with the file */
    osfcls(fp);

    /* if we read the zone table successfully, create a hash table from it */
    ZoneHashEntry **zone_index = 0;
    if (ok)
    {
        /* create the numerical index */
        zone_index = new ZoneHashEntry *[zone_cnt];

        /* populate it */
        const char *zone_end = zone_bytes_ + zone_table_len;
        int zi = 0;
        for (const char *p = zone_bytes_ ; p < zone_end ; )
        {
            /* read and skip the name length prefix */
            size_t len = osrp1(p);
            ++p;

            /* create this entry */
            ZoneHashEntry *e = new ZoneHashEntryDb(
                p, len, FALSE, osrp4(p+len+1), p+len+1+4);

            /* add it to the hash table and zone index */
            db_tab_->add(e);
            zone_index[zi++] = e;

            /* skip the name, seek pointer, and country code */
            p += len + 1 + 4 + 2;
        }

        /* read the links */
        const char *link_end = link_bytes_ + link_table_len;
        for (const char *p = link_bytes_ ; p < link_end ; )
        {
            /* read and skip the name length */
            size_t len = osrp1(p);
            ++p;

            /* read the TO index */
            unsigned int to = osrp4(p + len + 1);
            
            /* look up the TO field */
            ZoneHashEntry *e_to = (to < zone_cnt ? zone_index[to] : 0);

            /* if we found it, create the new entry for the FROM */
            if (e_to != 0)
                db_tab_->add(new ZoneHashEntryLink(p, len, FALSE, e_to));

            /* skip the entry */
            p += len + 1 + 4;
        }
    }

    /* if there are no errors so far, read the abbreviation table */
    if (ok)
    {
        /* create the abbreviation hash table */
        abbr_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);

        /* populate it */
        const char *abbr_end = abbr_bytes_ + abbr_table_len;
        for (const char *p = abbr_bytes_ ; p < abbr_end ; )
        {
            /* read and skip the abbreviation length prefix */
            size_t len = osrp1(p);
            ++p;

            /* read the number of zone entries */
            int entry_cnt = osrp1(p + len + 1);

            /* create and add the hash table entry */
            AbbrHashEntry *e = new AbbrHashEntry(p, len, FALSE, entry_cnt);
            abbr_tab_->add(e);

            /* populate the entry */
            int ei;
            for (p += len + 1 + 1, ei = 0 ; ei < entry_cnt ; p += 9, ++ei)
            {
                /* look up the zone */
                uint32_t zi = osrp4(p);
                ZoneHashEntry *zone = (zi < zone_cnt ? zone_index[zi] : 0);
                
                /* add the entry */
                e->set_zone(ei, zone, osrp4s(p+4), p[8]);
            }
        }
    }

    /* we're done with the numerical zone index */
    if (zone_index != 0)
        delete [] zone_index;

    /* return the status */
    index_loaded_ok_ = ok;
    return ok;
}